

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

double Catch::Benchmark::Detail::outlier_variance
                 (Estimate<double> mean,Estimate<double> stddev,int n)

{
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  __x = (double)n;
  dVar2 = mean.point / __x;
  dVar4 = dVar2 * 0.5 * 0.25;
  if (__x < 0.0) {
    dVar1 = sqrt(__x);
  }
  else {
    dVar1 = SQRT(__x);
  }
  dVar3 = stddev.point / dVar1;
  if (dVar4 <= stddev.point / dVar1) {
    dVar3 = dVar4;
  }
  dVar3 = dVar3 * dVar3;
  dVar1 = stddev.point * stddev.point;
  dVar7 = dVar2 * dVar2 * __x;
  dVar8 = dVar7 * (double)-n;
  dVar6 = dVar1 - __x * dVar3;
  dVar7 = dVar7 + dVar6;
  dVar4 = dVar7 * dVar7 + dVar8 * dVar3 * -4.0;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = ((__x + -1.0) / __x) * (dVar1 - (__x + -1.0) * dVar3);
  dVar7 = (double)(int)((dVar8 * -2.0) / (dVar4 + dVar7));
  dVar2 = dVar2 - dVar2 * 0.5;
  dVar4 = dVar2 * dVar2 * __x;
  dVar8 = (double)-n * dVar4;
  dVar4 = dVar4 + dVar6;
  dVar2 = dVar4 * dVar4 + dVar3 * -4.0 * dVar8;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = (double)(int)((dVar8 * -2.0) / (dVar2 + dVar4));
  if (dVar7 <= dVar2) {
    dVar2 = dVar7;
  }
  dVar2 = (dVar1 - (__x - dVar2) * dVar3) * ((__x - dVar2) / __x);
  if (dVar5 <= dVar2) {
    dVar2 = dVar5;
  }
  return dVar2 / dVar1;
}

Assistant:

double outlier_variance(Estimate<double> mean, Estimate<double> stddev, int n) {
                double sb = stddev.point;
                double mn = mean.point / n;
                double mg_min = mn / 2.;
                double sg = (std::min)(mg_min / 4., sb / std::sqrt(n));
                double sg2 = sg * sg;
                double sb2 = sb * sb;

                auto c_max = [n, mn, sb2, sg2](double x) -> double {
                    double k = mn - x;
                    double d = k * k;
                    double nd = n * d;
                    double k0 = -n * nd;
                    double k1 = sb2 - n * sg2 + nd;
                    double det = k1 * k1 - 4 * sg2 * k0;
                    return (int)(-2. * k0 / (k1 + std::sqrt(det)));
                };

                auto var_out = [n, sb2, sg2](double c) {
                    double nc = n - c;
                    return (nc / n) * (sb2 - nc * sg2);
                };

                return (std::min)(var_out(1), var_out((std::min)(c_max(0.), c_max(mg_min)))) / sb2;
            }